

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void MultiPCM_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  UINT32 addr;
  INT32 IVar4;
  int iVar5;
  slot_t *slot_00;
  INT16 w0_1;
  INT16 w0;
  UINT32 adr;
  INT32 sample;
  INT32 fpart;
  INT32 csample;
  UINT32 step;
  UINT32 spos;
  UINT32 vol;
  slot_t *slot;
  DEV_SMPL smpr;
  DEV_SMPL smpl;
  UINT32 sl;
  UINT32 i;
  MultiPCM *ptChip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *info_local;
  
  if (*(long *)((long)info + 0x2650) == 0) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
  }
  else {
    for (smpl = 0; (uint)smpl < samples; smpl = smpl + 1) {
      slot._4_4_ = 0;
      slot._0_4_ = 0;
      for (smpr = 0; (uint)smpr < 0x1c; smpr = smpr + 1) {
        slot_00 = (slot_t *)((long)info + (ulong)(uint)smpr * 0xb8 + 8);
        if ((slot_00->playing != '\0') && (slot_00->muted == '\0')) {
          uVar2 = slot_00->total_level >> 0xc | slot_00->pan << 7;
          csample = slot_00->offset >> 0xc;
          fpart = slot_00->step;
          uVar3 = slot_00->offset & 0xfff;
          if (slot_00->reverse != '\0') {
            csample = ((slot_00->sample).end - csample) + -1;
          }
          if (((slot_00->sample).format & 4) != 0) {
            addr = slot_00->base + ((uint)csample >> 1) * 3;
            if ((csample & 1U) == 0) {
              read_byte((MultiPCM *)info,addr);
              read_byte((MultiPCM *)info,addr + 1);
            }
            else {
              read_byte((MultiPCM *)info,addr + 2);
              read_byte((MultiPCM *)info,addr + 1);
            }
            break;
          }
          bVar1 = read_byte((MultiPCM *)info,slot_00->base + csample);
          _w0_1 = (int)((int)(short)((ushort)bVar1 << 8) * uVar3 +
                       slot_00->prev_sample * (0x1000 - uVar3)) >> 0xc;
          if (slot_00->vibrato != '\0') {
            IVar4 = pitch_lfo_step(&slot_00->pitch_lfo);
            fpart = (uint)(fpart * IVar4) >> 0xc;
          }
          slot_00->offset = fpart + slot_00->offset;
          if ((slot_00->sample).end << 0xc <= slot_00->offset) {
            slot_00->offset =
                 slot_00->offset + ((slot_00->sample).end - (slot_00->sample).loop) * -0x1000;
            slot_00->reverse = '\0';
          }
          if (csample != slot_00->offset >> 0xc) {
            slot_00->prev_sample = (int)(short)((ushort)bVar1 << 8);
          }
          if (slot_00->total_level >> 0xc != slot_00->dest_total_level) {
            slot_00->total_level = slot_00->total_level_step + slot_00->total_level;
          }
          if (slot_00->tremolo != '\0') {
            IVar4 = amplitude_lfo_step(&slot_00->amplitude_lfo);
            _w0_1 = _w0_1 * IVar4 >> 0xc;
          }
          IVar4 = envelope_generator_update((MultiPCM *)info,slot_00);
          iVar5 = _w0_1 * IVar4 >> 10;
          slot._4_4_ = (left_pan_table[uVar2] * iVar5 >> 0xc) + slot._4_4_;
          slot._0_4_ = (right_pan_table[uVar2] * iVar5 >> 0xc) + (int)slot;
        }
      }
      (*outputs)[(uint)smpl] = slot._4_4_;
      outputs[1][(uint)smpl] = (int)slot;
    }
  }
  return;
}

Assistant:

static void MultiPCM_update(void *info, UINT32 samples, DEV_SMPL **outputs)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	UINT32 i, sl;

	if (ptChip->ROM == NULL)
	{
		memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
		memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; ++i)
	{
		DEV_SMPL smpl = 0;
		DEV_SMPL smpr = 0;
		for (sl = 0; sl < 28; ++sl)
		{
			slot_t *slot = &ptChip->slots[sl];
			if (slot->playing && ! slot->muted)
			{
				UINT32 vol = (slot->total_level >> TL_SHIFT) | (slot->pan << 7);
				UINT32 spos = slot->offset >> TL_SHIFT;
				UINT32 step = slot->step;
				INT32 csample;
				INT32 fpart = slot->offset & ((1 << TL_SHIFT) - 1);
				INT32 sample;

				if (slot->reverse)
				{
					spos = slot->sample.end - spos - 1;
				}

				if (slot->sample.format & 4)	// 12-bit linear
				{
					UINT32 adr = slot->base + (spos >> 1) * 3;
					if (!(spos & 1))
					{ // ab.c ..
						INT16 w0 = (read_byte(ptChip, adr) << 8) | ((read_byte(ptChip, adr + 1) & 0xf) << 4);
						csample = w0;
						break;
					}
					else
					{ // ..C. AB
						INT16 w0 = (read_byte(ptChip, adr + 2) << 8) | (read_byte(ptChip, adr + 1) & 0xf0);
						csample = w0;
						break;
					}
				}
				else
				{
					csample = (INT16)(read_byte(ptChip, slot->base + spos) << 8);
				}

				sample = (csample * fpart + slot->prev_sample * ((1 << TL_SHIFT) - fpart)) >> TL_SHIFT;

				if (slot->vibrato) // Vibrato enabled
				{
					step = step * pitch_lfo_step(&slot->pitch_lfo);
					step >>= TL_SHIFT;
				}

				slot->offset += step;
				if (slot->offset >= (slot->sample.end << TL_SHIFT))
				{
					slot->offset -= (slot->sample.end - slot->sample.loop) << TL_SHIFT;
					// DD-9 expects the looped silence at the end of some samples to be the same whether reversed or not
					slot->reverse = false;
				}

				if (spos ^ (slot->offset >> TL_SHIFT))
				{
					slot->prev_sample = csample;
				}

				if ((slot->total_level >> TL_SHIFT) != slot->dest_total_level)
				{
					slot->total_level += slot->total_level_step;
				}

				if (slot->tremolo) // Tremolo enabled
				{
					sample = sample * amplitude_lfo_step(&slot->amplitude_lfo);
					sample >>= TL_SHIFT;
				}

				sample = (sample * envelope_generator_update(ptChip, slot)) >> 10;

				smpl += (left_pan_table[vol] * sample) >> TL_SHIFT;
				smpr += (right_pan_table[vol] * sample) >> TL_SHIFT;
			}
		}

		outputs[0][i] = smpl;
		outputs[1][i] = smpr;
	}
}